

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O1

int check_spellcraft(CHAR_DATA *ch,int sn)

{
  short sVar1;
  int iVar2;
  int iVar3;
  CClass *this;
  long lVar4;
  float fVar5;
  
  iVar2 = get_skill(ch,(int)gsn_spellcraft);
  iVar3 = number_range(0,5);
  fVar5 = (float)((iVar2 + -0x32) / 5) - (float)iVar3;
  iVar2 = 0;
  if (0.0 < fVar5) {
    sVar1 = ch->level;
    lVar4 = (long)gsn_spellcraft;
    this = ch->my_class;
    if ((this == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
      this = CClass::GetClass(0);
    }
    iVar3 = CClass::GetIndex(this);
    iVar2 = 0;
    if (*(short *)(lVar4 * 0x60 + 0x45a788 + (long)iVar3 * 2) <= sVar1) {
      iVar2 = 0;
      if (gsn_bash != sn) {
        iVar2 = get_curr_stat(ch,1);
        iVar2 = (int)(fVar5 / ((float)(0x1b - iVar2) * 0.5));
      }
      check_improve(ch,(int)gsn_spellcraft,true,8);
    }
  }
  return iVar2;
}

Assistant:

int check_spellcraft(CHAR_DATA *ch, int sn)
{
	float bonus;

	bonus = (get_skill(ch, gsn_spellcraft) - 50) / 5;
	bonus -= number_range(0, 5);

	if (bonus <= 0 || ch->level < skill_table[gsn_spellcraft].skill_level[ch->Class()->GetIndex()])
		return 0;

	/*
	 * Can make exemptions for specific spells, as in the nonsense example of
	 * bash-casting below.
	 */

	if (sn == gsn_bash)
		bonus = 0;
	else
		bonus /= 0.5 * (27 - get_curr_stat(ch, STAT_INT));

	check_improve(ch, gsn_spellcraft, true, 8);

	return (int)bonus;
}